

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void testing::internal::TuplePrefix<1ul>::
     ExplainMatchFailuresTo<std::tr1::tuple<testing::Matcher<wchar_t>,void,void,void,void,void,void,void,void,void>,std::tr1::tuple<wchar_t,void,void,void,void,void,void,void,void,void>>
               (tuple<testing::Matcher<wchar_t>,_void,_void,_void,_void,_void,_void,_void,_void,_void>
                *matchers,
               tuple<wchar_t,_void,_void,_void,_void,_void,_void,_void,_void,_void> *values,
               ostream *os)

{
  bool bVar1;
  ostream *this;
  StringMatchResultListener *this_00;
  ostream *in_RDX;
  tuple<wchar_t,_void,_void,_void,_void,_void,_void,_void,_void,_void> *in_RSI;
  tuple<testing::Matcher<wchar_t>,_void,_void,_void,_void,_void,_void,_void,_void,_void> *in_RDI;
  StringMatchResultListener listener;
  Value value;
  type matcher;
  Matcher<wchar_t> *in_stack_fffffffffffffdd8;
  wchar_t x;
  StringMatchResultListener *in_stack_fffffffffffffde0;
  StringMatchResultListener *in_stack_fffffffffffffe00;
  
  TuplePrefix<0ul>::
  ExplainMatchFailuresTo<std::tr1::tuple<testing::Matcher<wchar_t>,void,void,void,void,void,void,void,void,void>,std::tr1::tuple<wchar_t,void,void,void,void,void,void,void,void,void>>
            (in_RDI,in_RSI,in_RDX);
  std::tr1::get<0,testing::Matcher<wchar_t>,void,void,void,void,void,void,void,void,void>
            ((tuple<testing::Matcher<wchar_t>,_void,_void,_void,_void,_void,_void,_void,_void,_void>
              *)0x16dcd9);
  Matcher<wchar_t>::Matcher((Matcher<wchar_t> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8)
  ;
  x = (wchar_t)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
  std::tr1::get<0,wchar_t,void,void,void,void,void,void,void,void,void>
            ((tuple<wchar_t,_void,_void,_void,_void,_void,_void,_void,_void,_void> *)0x16dcf6);
  StringMatchResultListener::StringMatchResultListener(in_stack_fffffffffffffe00);
  bVar1 = MatcherBase<wchar_t>::MatchAndExplain
                    ((MatcherBase<wchar_t> *)in_stack_fffffffffffffde0,x,
                     (MatchResultListener *)0x16dd30);
  if (!bVar1) {
    this = std::operator<<(in_RDX,"  Expected arg #");
    in_stack_fffffffffffffde0 = (StringMatchResultListener *)std::ostream::operator<<(this,0);
    std::operator<<((ostream *)in_stack_fffffffffffffde0,": ");
    this_00 = (StringMatchResultListener *)
              std::tr1::
              get<0,testing::Matcher<wchar_t>,void,void,void,void,void,void,void,void,void>
                        ((tuple<testing::Matcher<wchar_t>,_void,_void,_void,_void,_void,_void,_void,_void,_void>
                          *)0x16dd94);
    MatcherBase<wchar_t>::DescribeTo
              ((MatcherBase<wchar_t> *)in_stack_fffffffffffffde0,(ostream *)this_00);
    std::operator<<(in_RDX,"\n           Actual: ");
    UniversalPrint<wchar_t>((wchar_t *)in_stack_fffffffffffffde0,(ostream *)this_00);
    StringMatchResultListener::str_abi_cxx11_(this_00);
    PrintIfNotEmpty((string *)in_stack_fffffffffffffde0,(ostream *)this_00);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe00);
    std::operator<<(in_RDX,"\n");
  }
  StringMatchResultListener::~StringMatchResultListener(in_stack_fffffffffffffde0);
  Matcher<wchar_t>::~Matcher((Matcher<wchar_t> *)0x16de84);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    using ::std::tr1::tuple_element;
    using ::std::tr1::get;

    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename tuple_element<N - 1, MatcherTuple>::type matcher =
        get<N - 1>(matchers);
    typedef typename tuple_element<N - 1, ValueTuple>::type Value;
    Value value = get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      // TODO(wan): include in the message the name of the parameter
      // as used in MOCK_METHOD*() when possible.
      *os << "  Expected arg #" << N - 1 << ": ";
      get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }